

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fftnd.c
# Opt level: O3

kiss_fftnd_cfg kiss_fftnd_alloc(int *dims,int ndims,int inverse_fft,void *mem,size_t *lenmem)

{
  size_t __size;
  int *piVar1;
  ulong uVar2;
  int iVar3;
  kiss_fftnd_cfg pkVar4;
  kiss_fft_cfg pkVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  kiss_fft_cpx *mem_00;
  int iVar9;
  size_t sublen;
  size_t local_50;
  size_t *local_48;
  ulong local_40;
  kiss_fftnd_cfg local_38;
  
  local_40 = CONCAT44(local_40._4_4_,ndims);
  local_48 = lenmem;
  local_38 = (kiss_fftnd_cfg)mem;
  if (ndims < 1) {
    lVar8 = 0x20;
    iVar9 = 1;
  }
  else {
    iVar9 = 1;
    lVar8 = 0x20;
    uVar7 = 0;
    do {
      local_50 = 0;
      kiss_fft_alloc(dims[uVar7],inverse_fft,(void *)0x0,&local_50);
      iVar9 = iVar9 * dims[uVar7];
      lVar8 = lVar8 + local_50;
      uVar7 = uVar7 + 1;
    } while ((uint)ndims != uVar7);
  }
  uVar7 = local_40;
  iVar3 = (int)local_40;
  lVar6 = (long)(int)local_40;
  __size = lVar8 + lVar6 * 0xc + (long)iVar9 * 8;
  if (local_48 == (size_t *)0x0) {
    local_38 = (kiss_fftnd_cfg)malloc(__size);
  }
  else {
    uVar2 = *local_48;
    *local_48 = __size;
    if (uVar2 < __size) {
      return (kiss_fftnd_cfg)0x0;
    }
  }
  pkVar4 = local_38;
  if (local_38 == (kiss_fftnd_cfg)0x0) {
    return (kiss_fftnd_cfg)0x0;
  }
  local_38->dimprod = iVar9;
  local_38->ndims = iVar3;
  piVar1 = &local_38[1].dimprod + lVar6 * 2;
  local_38->states = (kiss_fft_cfg *)(local_38 + 1);
  local_38->dims = piVar1;
  mem_00 = (kiss_fft_cpx *)(piVar1 + lVar6) + iVar9;
  local_38->tmpbuf = (kiss_fft_cpx *)(piVar1 + lVar6);
  local_48 = (size_t *)__size;
  if (0 < iVar3) {
    local_40 = uVar7 & 0xffffffff;
    uVar7 = 0;
    do {
      iVar9 = dims[uVar7];
      pkVar4->dims[uVar7] = iVar9;
      kiss_fft_alloc(iVar9,inverse_fft,(void *)0x0,&local_50);
      pkVar5 = kiss_fft_alloc(pkVar4->dims[uVar7],inverse_fft,mem_00,&local_50);
      pkVar4->states[uVar7] = pkVar5;
      uVar7 = uVar7 + 1;
      mem_00 = (kiss_fft_cpx *)((long)&mem_00->r + local_50);
    } while (local_40 != uVar7);
  }
  if ((long)mem_00 - (long)pkVar4 != (long)(int)local_48) {
    kiss_fftnd_alloc_cold_1();
    return pkVar4;
  }
  return pkVar4;
}

Assistant:

kiss_fftnd_cfg kiss_fftnd_alloc(const int *dims,int ndims,int inverse_fft,void*mem,size_t*lenmem)
{
    kiss_fftnd_cfg st = NULL;
    int i;
    int dimprod=1;
    size_t memneeded = sizeof(struct kiss_fftnd_state);
    char * ptr;

    for (i=0;i<ndims;++i) {
        size_t sublen=0;
        kiss_fft_alloc (dims[i], inverse_fft, NULL, &sublen);
        memneeded += sublen;   /* st->states[i] */
        dimprod *= dims[i];
    }
    memneeded += sizeof(int) * ndims;/*  st->dims */
    memneeded += sizeof(void*) * ndims;/* st->states  */
    memneeded += sizeof(kiss_fft_cpx) * dimprod; /* st->tmpbuf */

    if (lenmem == NULL) {/* allocate for the caller*/
        st = (kiss_fftnd_cfg) malloc (memneeded);
    } else { /* initialize supplied buffer if big enough */
        if (*lenmem >= memneeded)
            st = (kiss_fftnd_cfg) mem;
        *lenmem = memneeded; /*tell caller how big struct is (or would be) */
    }
    if (!st)
        return NULL; /*malloc failed or buffer too small */

    st->dimprod = dimprod;
    st->ndims = ndims;
    ptr=(char*)(st+1);

    st->states = (kiss_fft_cfg *)ptr;
    ptr += sizeof(void*) * ndims;

    st->dims = (int*)ptr;
    ptr += sizeof(int) * ndims;

    st->tmpbuf = (kiss_fft_cpx*)ptr;
    ptr += sizeof(kiss_fft_cpx) * dimprod;

    for (i=0;i<ndims;++i) {
        size_t len;
        st->dims[i] = dims[i];
        kiss_fft_alloc (st->dims[i], inverse_fft, NULL, &len);
        st->states[i] = kiss_fft_alloc (st->dims[i], inverse_fft, ptr,&len);
        ptr += len;
    }
    /*
Hi there!

If you're looking at this particular code, it probably means you've got a brain-dead bounds checker 
that thinks the above code overwrites the end of the array.

It doesn't.

-- Mark 

P.S.
The below code might give you some warm fuzzies and help convince you.
       */
    if ( ptr - (char*)st != (int)memneeded ) {
        fprintf(stderr,
                "################################################################################\n"
                "Internal error! Memory allocation miscalculation\n"
                "################################################################################\n"
               );
    }
    return st;
}